

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.h
# Opt level: O2

void __thiscall Connection::Connection(Connection *this)

{
  SSL_METHOD *meth;
  SSL_CTX *ctx;
  SSL *pSVar1;
  
  this->eof = false;
  this->handle = (SSL *)0x0;
  this->method = (SSL_METHOD *)0x0;
  this->ctx = (SSL_CTX *)0x0;
  this->fd = -1;
  meth = (SSL_METHOD *)ssl::TLS_client_method();
  this->method = meth;
  ctx = ssl::SSL_CTX_new(meth);
  this->ctx = ctx;
  if (ctx != (SSL_CTX *)0x0) {
    ssl::SSL_CTX_set_verify(ctx,0,verify_callback);
    pSVar1 = ssl::SSL_new((SSL_CTX *)this->ctx);
    this->handle = pSVar1;
    return;
  }
  __assert_fail("ctx != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sandsmark[P]sponsoryeet/connection.h"
                ,0x21,"Connection::Connection()");
}

Assistant:

Connection()
    {
        method = ssl::TLS_client_method();
        ctx = ssl::SSL_CTX_new(method);
        assert(ctx != nullptr);
        ssl::SSL_CTX_set_verify(ctx, ssl::SSL_VERIFY_NONE, verify_callback);
        handle = ssl::SSL_new(ctx);
    }